

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatcher_manager.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Method_dispatcher_manager::push_back
          (Method_dispatcher_manager *this,Method_dispatcher_base *mdisp)

{
  Method_dispatcher_base *local_18;
  Method_dispatcher_base *mdisp_local;
  Method_dispatcher_manager *this_local;
  
  local_18 = mdisp;
  mdisp_local = (Method_dispatcher_base *)this;
  std::
  deque<iqxmlrpc::Method_dispatcher_base_*,_std::allocator<iqxmlrpc::Method_dispatcher_base_*>_>::
  push_back(&this->impl_->dispatchers,&local_18);
  return;
}

Assistant:

void Method_dispatcher_manager::push_back(Method_dispatcher_base* mdisp)
{
  impl_->dispatchers.push_back(mdisp);
}